

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eliminate_dead_members_pass.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::EliminateDeadMembersPass::UpdateCompositeInsert
          (EliminateDeadMembersPass *this,Instruction *inst)

{
  Op OVar1;
  uint32_t uVar2;
  uint32_t index;
  DefUseManager *pDVar3;
  Instruction *pIVar4;
  Operand *__args;
  uint32_t i;
  uint32_t uVar5;
  ulong uVar6;
  bool bVar7;
  bool bVar8;
  initializer_list<unsigned_int> init_list;
  uint32_t local_bc;
  EliminateDeadMembersPass *local_b8;
  ulong local_b0;
  OperandList new_operands;
  Operand local_88;
  SmallVector<unsigned_int,_2UL> local_58;
  
  if (inst->opcode_ == OpCompositeInsert) {
    uVar2 = 1;
    uVar6 = 2;
LAB_004b6607:
    uVar2 = Instruction::GetSingleWordInOperand(inst,uVar2);
    pDVar3 = Pass::get_def_use_mgr((Pass *)this);
    pIVar4 = analysis::DefUseManager::GetDef(pDVar3,uVar2);
    uVar2 = Instruction::type_id(pIVar4);
    new_operands.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    new_operands.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    new_operands.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    for (uVar5 = 0; (uint32_t)uVar6 != uVar5; uVar5 = uVar5 + 1) {
      __args = Instruction::GetInOperand(inst,uVar5);
      std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
      emplace_back<spvtools::opt::Operand&>
                ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)
                 &new_operands,__args);
    }
    bVar7 = false;
    local_b8 = this;
    do {
      uVar5 = Instruction::NumInOperands(inst);
      if (uVar5 <= (uint)uVar6) {
        if (bVar7) {
          Instruction::SetInOperands(inst,&new_operands);
          IRContext::UpdateDefUse((local_b8->super_MemPass).super_Pass.context_,inst);
LAB_004b67cd:
          bVar7 = true;
        }
        else {
          bVar7 = false;
        }
        std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                  (&new_operands);
        return bVar7;
      }
      uVar5 = Instruction::GetSingleWordInOperand(inst,(uint)uVar6);
      index = GetNewMemberIndex(this,uVar2,uVar5);
      if (index == 0xffffffff) {
        IRContext::KillInst((this->super_MemPass).super_Pass.context_,inst);
        goto LAB_004b67cd;
      }
      bVar8 = uVar5 != index;
      init_list._M_len = 1;
      init_list._M_array = &local_bc;
      local_bc = index;
      local_b0 = uVar6;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_58,init_list);
      local_88.type = SPV_OPERAND_TYPE_LITERAL_INTEGER;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_88.words,&local_58);
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
      emplace_back<spvtools::opt::Operand>(&new_operands,&local_88);
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_88.words);
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_58);
      pDVar3 = Pass::get_def_use_mgr((Pass *)this);
      uVar6 = local_b0;
      pIVar4 = analysis::DefUseManager::GetDef(pDVar3,uVar2);
      OVar1 = pIVar4->opcode_;
      if (OVar1 < OpTypeOpaque) {
        if ((0x31800000U >> (OVar1 & OpTypeOpaque) & 1) != 0) goto LAB_004b673d;
        if (OVar1 != OpTypeStruct) goto LAB_004b675e;
      }
      else {
LAB_004b675e:
        if (((OVar1 != OpTypeCooperativeMatrixKHR) && (OVar1 != OpTypeCooperativeMatrixNV)) &&
           (OVar1 != OpTypeCooperativeVectorNV)) {
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/eliminate_dead_members_pass.cpp"
                        ,0x299,
                        "bool spvtools::opt::EliminateDeadMembersPass::UpdateCompositeInsert(Instruction *)"
                       );
        }
LAB_004b673d:
        index = 0;
      }
      bVar7 = (bool)(bVar7 | bVar8);
      uVar2 = Instruction::GetSingleWordInOperand(pIVar4,index);
      uVar6 = (ulong)((int)uVar6 + 1);
    } while( true );
  }
  if (inst->opcode_ == OpSpecConstantOp) {
    uVar2 = Instruction::GetSingleWordInOperand(inst,0);
    if (uVar2 == 0x52) {
      bVar7 = inst->opcode_ == OpSpecConstantOp;
      uVar2 = bVar7 + 1;
      uVar6 = (ulong)(bVar7 | 2);
      goto LAB_004b6607;
    }
  }
  __assert_fail("inst->opcode() == spv::Op::OpCompositeInsert || (inst->opcode() == spv::Op::OpSpecConstantOp && spv::Op(inst->GetSingleWordInOperand(kSpecConstOpOpcodeIdx)) == spv::Op::OpCompositeInsert)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/eliminate_dead_members_pass.cpp"
                ,0x269,
                "bool spvtools::opt::EliminateDeadMembersPass::UpdateCompositeInsert(Instruction *)"
               );
}

Assistant:

bool EliminateDeadMembersPass::UpdateCompositeInsert(Instruction* inst) {
  assert(inst->opcode() == spv::Op::OpCompositeInsert ||
         (inst->opcode() == spv::Op::OpSpecConstantOp &&
          spv::Op(inst->GetSingleWordInOperand(kSpecConstOpOpcodeIdx)) ==
              spv::Op::OpCompositeInsert));

  uint32_t first_operand = 0;
  if (inst->opcode() == spv::Op::OpSpecConstantOp) {
    first_operand = 1;
  }

  uint32_t composite_id = inst->GetSingleWordInOperand(first_operand + 1);
  Instruction* composite_inst = get_def_use_mgr()->GetDef(composite_id);
  uint32_t type_id = composite_inst->type_id();

  Instruction::OperandList new_operands;
  bool modified = false;

  for (uint32_t i = 0; i < first_operand + 2; ++i) {
    new_operands.emplace_back(inst->GetInOperand(i));
  }
  for (uint32_t i = first_operand + 2; i < inst->NumInOperands(); ++i) {
    uint32_t member_idx = inst->GetSingleWordInOperand(i);
    uint32_t new_member_idx = GetNewMemberIndex(type_id, member_idx);
    if (new_member_idx == kRemovedMember) {
      context()->KillInst(inst);
      return true;
    }

    if (member_idx != new_member_idx) {
      modified = true;
    }
    new_operands.emplace_back(
        Operand({SPV_OPERAND_TYPE_LITERAL_INTEGER, {new_member_idx}}));

    Instruction* type_inst = get_def_use_mgr()->GetDef(type_id);
    switch (type_inst->opcode()) {
      case spv::Op::OpTypeStruct:
        // The type will have already been rewritten, so use the new member
        // index.
        type_id = type_inst->GetSingleWordInOperand(new_member_idx);
        break;
      case spv::Op::OpTypeArray:
      case spv::Op::OpTypeRuntimeArray:
      case spv::Op::OpTypeVector:
      case spv::Op::OpTypeMatrix:
      case spv::Op::OpTypeCooperativeMatrixNV:
      case spv::Op::OpTypeCooperativeMatrixKHR:
      case spv::Op::OpTypeCooperativeVectorNV:
        type_id = type_inst->GetSingleWordInOperand(0);
        break;
      default:
        assert(false);
    }
  }

  if (!modified) {
    return false;
  }
  inst->SetInOperands(std::move(new_operands));
  context()->UpdateDefUse(inst);
  return true;
}